

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setMinimumHeight(QWidget *this,int h)

{
  long lVar1;
  pointer pQVar2;
  int in_ESI;
  long in_FS_OFFSET;
  QWidget *in_stack_00000008;
  uint expl;
  QWidgetPrivate *d;
  int in_stack_00000018;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  ushort uVar3;
  undefined2 in_stack_ffffffffffffffd6;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x36b91d);
  QWidgetPrivate::createExtra
            ((QWidgetPrivate *)
             CONCAT26(in_stack_ffffffffffffffd6,
                      CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)));
  pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b93a);
  uVar3 = *(ushort *)&pQVar2->field_0x7c & 3 | (ushort)(in_ESI != 0) * 2;
  minimumSize((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
  QSize::width((QSize *)0x36b96d);
  setMinimumSize(in_stack_00000008,h,in_stack_00000018);
  pQVar2 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b993);
  *(ushort *)&pQVar2->field_0x7c = (ushort)*(undefined4 *)&pQVar2->field_0x7c & 0xfffc | uVar3 & 3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setMinimumHeight(int h)
{
    Q_D(QWidget);
    d->createExtra();
    uint expl = d->extra->explicitMinSize | (h ? Qt::Vertical : 0);
    setMinimumSize(minimumSize().width(), h);
    d->extra->explicitMinSize = expl;
}